

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::OpenPopupOnItemClick(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  uint in_ESI;
  long in_RDI;
  ImGuiID id;
  int mouse_button;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *str_end;
  ImGuiContext *str;
  undefined4 in_stack_fffffffffffffff0;
  
  str_end = GImGui->CurrentWindow;
  str = GImGui;
  bVar1 = IsMouseReleased(in_ESI & 0x1f);
  if ((bVar1) && (bVar1 = IsItemHovered((ImGuiHoveredFlags)str_end), bVar1)) {
    if (in_RDI != 0) {
      ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),&str->Initialized
                         ,(char *)str_end);
    }
    OpenPopupEx(g._4_4_,(ImGuiPopupFlags)g);
  }
  return;
}

Assistant:

void ImGui::OpenPopupOnItemClick(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
    {
        ImGuiID id = str_id ? window->GetID(str_id) : g.LastItemData.ID;    // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
        IM_ASSERT(id != 0);                                             // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
        OpenPopupEx(id, popup_flags);
    }
}